

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QGate1.cpp
# Opt level: O2

void __thiscall
qclab::qgates::QGate1<double>::apply
          (QGate1<double> *this,Op op,int nbQubits,vector<double,_std::allocator<double>_> *vector,
          int offset)

{
  int iVar1;
  anon_class_40_5_d6c92a71 f;
  SquareMatrix<double> local_68;
  anon_class_40_5_d6c92a71 local_58;
  
  iVar1 = (*(this->super_QObject<double>)._vptr_QObject[3])();
  (*(this->super_QObject<double>)._vptr_QObject[7])(&local_68,this);
  lambda_QGate1<double>
            (&local_58,op,&local_68,
             (vector->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start);
  std::unique_ptr<double[],_std::default_delete<double[]>_>::~unique_ptr(&local_68.data_);
  apply2<qclab::qgates::lambda_QGate1<double>(qclab::Op,qclab::dense::SquareMatrix<double>,double*)::_lambda(unsigned_long,unsigned_long)_1_>
            (nbQubits,iVar1 + offset,&local_58);
  return;
}

Assistant:

void QGate1< T >::apply( Op op , const int nbQubits ,
                           std::vector< T >& vector , const int offset ) const {
    const int qubit = this->qubit() + offset ;
    auto f = lambda_QGate1( op , this->matrix() , vector.data() ) ;
    apply2( nbQubits , qubit , f ) ;
  }